

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMain.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  deUint32 flags;
  char *fileName;
  Platform *pPVar2;
  App *pAVar3;
  exception *e;
  undefined1 local_d8 [8];
  UniquePtr<tcu::App,_de::DefaultDeleter<tcu::App>_> app;
  undefined1 local_c0 [8];
  UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> platform;
  TestLog log;
  DirArchive archive;
  undefined1 local_70 [8];
  CommandLine cmdLine;
  char **argv_local;
  int argc_local;
  
  cmdLine._80_8_ = argv;
  setvbuf(_stdout,(char *)0x0,1,0x1000);
  tcu::CommandLine::CommandLine((CommandLine *)local_70,argc,(char **)cmdLine._80_8_);
  tcu::DirArchive::DirArchive((DirArchive *)&log,".");
  fileName = tcu::CommandLine::getLogFileName((CommandLine *)local_70);
  flags = tcu::CommandLine::getLogFlags((CommandLine *)local_70);
  tcu::TestLog::TestLog
            ((TestLog *)
             &platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>.m_data.
              field_0x8,fileName,flags);
  pPVar2 = createPlatform();
  de::DefaultDeleter<tcu::Platform>::DefaultDeleter
            ((DefaultDeleter<tcu::Platform> *)
             &app.super_UniqueBase<tcu::App,_de::DefaultDeleter<tcu::App>_>.m_data.field_0xf);
  de::details::UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::UniquePtr
            ((UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> *)local_c0,pPVar2);
  pAVar3 = (App *)operator_new(0x48);
  pPVar2 = de::details::UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::operator*
                     ((UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> *)local_c0);
  tcu::App::App(pAVar3,pPVar2,(Archive *)&log,
                (TestLog *)
                &platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>.m_data
                 .field_0x8,(CommandLine *)local_70);
  de::DefaultDeleter<tcu::App>::DefaultDeleter((DefaultDeleter<tcu::App> *)((long)&e + 7));
  de::details::UniquePtr<tcu::App,_de::DefaultDeleter<tcu::App>_>::UniquePtr
            ((UniquePtr<tcu::App,_de::DefaultDeleter<tcu::App>_> *)local_d8,pAVar3);
  do {
    pAVar3 = de::details::UniqueBase<tcu::App,_de::DefaultDeleter<tcu::App>_>::operator->
                       ((UniqueBase<tcu::App,_de::DefaultDeleter<tcu::App>_> *)local_d8);
    bVar1 = tcu::App::iterate(pAVar3);
  } while (bVar1);
  de::details::UniquePtr<tcu::App,_de::DefaultDeleter<tcu::App>_>::~UniquePtr
            ((UniquePtr<tcu::App,_de::DefaultDeleter<tcu::App>_> *)local_d8);
  de::details::UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::~UniquePtr
            ((UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> *)local_c0);
  tcu::TestLog::~TestLog
            ((TestLog *)
             &platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>.m_data.
              field_0x8);
  tcu::DirArchive::~DirArchive((DirArchive *)&log);
  tcu::CommandLine::~CommandLine((CommandLine *)local_70);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
#if (DE_OS != DE_OS_WIN32)
	// Set stdout to line-buffered mode (will be fully buffered by default if stdout is pipe).
	setvbuf(stdout, DE_NULL, _IOLBF, 4*1024);
#endif

	try
	{
		tcu::CommandLine				cmdLine		(argc, argv);
		tcu::DirArchive					archive		(".");
		tcu::TestLog					log			(cmdLine.getLogFileName(), cmdLine.getLogFlags());
		de::UniquePtr<tcu::Platform>	platform	(createPlatform());
		de::UniquePtr<tcu::App>			app			(new tcu::App(*platform, archive, log, cmdLine));

		// Main loop.
		for (;;)
		{
			if (!app->iterate())
				break;
		}
	}
	catch (const std::exception& e)
	{
		tcu::die("%s", e.what());
	}

	return 0;
}